

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O2

sc_signed * sc_dt::operator*(sc_signed *__return_storage_ptr__,long u,sc_unsigned *v)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  sc_digit ud [3];
  
  iVar1 = v->sgn;
  if (u < 1) {
    if (u == 0) goto LAB_001d5469;
    bVar2 = (ulong)u < 0x8000000000000001;
    u = -u;
    if (bVar2) {
      u = 0x8000000000000000;
    }
    iVar3 = -1;
  }
  else {
    iVar3 = 1;
  }
  if (iVar1 != 0) {
    from_uint<unsigned_long>(3,ud,u);
    mul_signed_friend(__return_storage_ptr__,(uint)(iVar1 == iVar3) * 2 + -1,0x40,3,ud,v->nbits,
                      v->ndigits,v->digit);
    return __return_storage_ptr__;
  }
LAB_001d5469:
  sc_length_param::sc_length_param((sc_length_param *)ud);
  sc_signed::sc_signed(__return_storage_ptr__,ud[0]);
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator*(long u, const sc_unsigned& v)
{

  small_type s = mul_signs(v.sgn, get_sign(u));

  if (s == SC_ZERO) // case 1
    return sc_signed();

  CONVERT_LONG_2(u);

  // cases 2-4
  return mul_signed_friend(s, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.nbits, v.ndigits, v.digit);

}